

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  Real eps;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  ulong uVar19;
  cpp_dec_float<100U,_int,_void> *this_00;
  ulong uVar20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  uVar4 = rhs->memused;
  *(undefined4 *)(this + 8) = 0;
  uVar20 = 0;
  uVar19 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar19 = uVar20;
  }
  for (; uVar19 * 0x54 != uVar20; uVar20 = uVar20 + 0x54) {
    pNVar9 = rhs->m_elem;
    iVar5 = *(int *)((long)(&pNVar9->val + 1) + uVar20);
    puVar1 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20);
    uVar10 = *puVar1;
    uVar11 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20 + 0x10);
    uVar12 = *puVar1;
    uVar13 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20 + 0x20);
    uVar14 = *puVar1;
    uVar15 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20 + 0x30);
    uVar16 = *puVar1;
    uVar17 = puVar1[1];
    iVar6 = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar20);
    bVar3 = *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar20 + 4);
    fVar7 = *(fpclass_type *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar20 + 8);
    iVar8 = *(int32_t *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar20 + 0xc);
    puVar2 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20);
    local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
    local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20 + 0x10);
    local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20 + 0x20);
    local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
    local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + uVar20 + 0x30);
    local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
    local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
    local_88.m_backend.exp = iVar6;
    local_88.m_backend.neg = bVar3;
    local_88.m_backend.fpclass = fVar7;
    local_88.m_backend.prec_elem = iVar8;
    eps = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
    bVar18 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_88,eps);
    this_00 = (cpp_dec_float<100U,_int,_void> *)((long)iVar5 * 0x50 + *(long *)(this + 0x20));
    if (bVar18) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,0);
    }
    else {
      *(undefined8 *)((this_00->data)._M_elems + 0xc) = uVar16;
      *(undefined8 *)((this_00->data)._M_elems + 0xe) = uVar17;
      *(undefined8 *)((this_00->data)._M_elems + 8) = uVar14;
      *(undefined8 *)((this_00->data)._M_elems + 10) = uVar15;
      *(undefined8 *)((this_00->data)._M_elems + 4) = uVar12;
      *(undefined8 *)((this_00->data)._M_elems + 6) = uVar13;
      *(undefined8 *)(this_00->data)._M_elems = uVar10;
      *(undefined8 *)((this_00->data)._M_elems + 2) = uVar11;
      this_00->exp = iVar6;
      this_00->neg = bVar3;
      this_00->fpclass = fVar7;
      this_00->prec_elem = iVar8;
      iVar6 = *(int *)(this + 8);
      *(int *)(this + 8) = iVar6 + 1;
      *(int *)(*(long *)(this + 0x10) + (long)iVar6 * 4) = iVar5;
    }
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign(const SVectorBase<S>& rhs)
{
   assert(rhs.dim() <= VectorBase<R>::dim());

   int s = rhs.size();
   num = 0;

   for(int i = 0; i < s; ++i)
   {
      int k = rhs.index(i);
      S v = rhs.value(i);

      if(isZero(v, this->tolerances()->epsilon()))
         VectorBase<R>::val[k] = 0;
      else
      {
         VectorBase<R>::val[k] = v;
         idx[num++] = k;
      }
   }

   setupStatus = true;

   assert(isConsistent());

   return *this;
}